

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Arg * __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::dbgName_abi_cxx11_(Arg *this)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  allocator local_19 [9];
  Arg *this_local;
  
  this_local = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"--");
  }
  else {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(in_RSI + 8));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"positional args",local_19);
      std::allocator<char>::~allocator((allocator<char> *)local_19);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 8),0);
      std::operator+((char *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c7c80);
    }
  }
  return this;
}

Assistant:

std::string dbgName() const {
                if( !longName.empty() )
                    return "--" + longName;
                if( !shortNames.empty() )
                    return "-" + shortNames[0];
                return "positional args";
            }